

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenBoundingBoxesProcess.cpp
# Opt level: O0

void __thiscall utGenBoundingBoxesProcess::SetUp(utGenBoundingBoxesProcess *this)

{
  GenBoundingBoxesProcess *this_00;
  aiMesh *this_01;
  aiVector3D *paVar1;
  aiScene *this_02;
  aiMesh **ppaVar2;
  float _x;
  aiVector3t<float> *local_48;
  aiVector3t<float> local_2c;
  uint local_20;
  uint i;
  utGenBoundingBoxesProcess *local_10;
  utGenBoundingBoxesProcess *this_local;
  
  local_10 = this;
  this_00 = (GenBoundingBoxesProcess *)operator_new(0x18);
  Assimp::GenBoundingBoxesProcess::GenBoundingBoxesProcess(this_00);
  this->mProcess = this_00;
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  this->mMesh = this_01;
  this->mMesh->mNumVertices = 100;
  paVar1 = (aiVector3D *)operator_new__(0x4b0);
  local_48 = paVar1;
  do {
    aiVector3t<float>::aiVector3t(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != paVar1 + 100);
  this->mMesh->mVertices = paVar1;
  for (local_20 = 0; local_20 < 100; local_20 = local_20 + 1) {
    _x = (float)local_20;
    aiVector3t<float>::aiVector3t(&local_2c,_x,_x,_x);
    paVar1 = this->mMesh->mVertices + local_20;
    paVar1->x = local_2c.x;
    paVar1->y = local_2c.y;
    paVar1->z = local_2c.z;
  }
  this_02 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_02);
  this->mScene = this_02;
  this->mScene->mNumMeshes = 1;
  ppaVar2 = (aiMesh **)operator_new__(8);
  this->mScene->mMeshes = ppaVar2;
  *this->mScene->mMeshes = this->mMesh;
  return;
}

Assistant:

void SetUp() override {
        mProcess = new GenBoundingBoxesProcess;
        mMesh = new aiMesh();
        mMesh->mNumVertices = 100;
        mMesh->mVertices = new aiVector3D[100];
        for (unsigned int i = 0; i < 100; ++i) {
            mMesh->mVertices[i] = aiVector3D((ai_real)i, (ai_real)i, (ai_real)i);
        }
        mScene = new aiScene();
        mScene->mNumMeshes = 1;
        mScene->mMeshes = new aiMesh*[1];
        mScene->mMeshes[0] = mMesh;
    }